

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getToken(uchar **pz)

{
  int iVar1;
  uchar *z;
  int t;
  int local_1c;
  
  z = *pz;
  do {
    iVar1 = sqlite3GetToken(z,&local_1c);
    z = z + iVar1;
  } while ((long)local_1c == 0xae);
  if ((((local_1c - 0x6eU < 0x30) &&
       ((0xc00000000003U >> ((ulong)(local_1c - 0x6eU) & 0x3f) & 1) != 0)) || (local_1c == 0x3b)) ||
     ((local_1c < 0x5f && (yyFallback[local_1c] == 0x3b)))) {
    local_1c = 0x3b;
  }
  *pz = z;
  return local_1c;
}

Assistant:

static int getToken(const unsigned char **pz){
  const unsigned char *z = *pz;
  int t;                          /* Token type to return */
  do {
    z += sqlite3GetToken(z, &t);
  }while( t==TK_SPACE );
  if( t==TK_ID 
   || t==TK_STRING 
   || t==TK_JOIN_KW 
   || t==TK_WINDOW 
   || t==TK_OVER 
   || sqlite3ParserFallback(t)==TK_ID 
  ){
    t = TK_ID;
  }
  *pz = z;
  return t;
}